

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.h
# Opt level: O1

void __thiscall GrcManager::SetCompilerVersionFor(GrcManager *this,int fxdSilfVersion)

{
  if (fxdSilfVersion < 0x30001) {
    if (fxdSilfVersion < 0x20001) {
      if ((fxdSilfVersion == 0x10000) || (fxdSilfVersion == 0x20000)) goto LAB_00143ff3;
    }
    else {
      if (fxdSilfVersion == 0x20001) {
LAB_00143fd2:
        fxdSilfVersion = 0x40001;
        goto LAB_00143ff3;
      }
      if (fxdSilfVersion == 0x30000) goto LAB_00143ff3;
    }
  }
  else if (fxdSilfVersion < 0x40000) {
    if (fxdSilfVersion == 0x30001) {
      fxdSilfVersion = 0x40000;
      goto LAB_00143ff3;
    }
    if (fxdSilfVersion == 0x30002) goto LAB_00143fd2;
  }
  else {
    if (fxdSilfVersion == 0x40000) {
      fxdSilfVersion = 0x40002;
      goto LAB_00143ff3;
    }
    if (fxdSilfVersion == 0x40001) {
      fxdSilfVersion = 0x50000;
      goto LAB_00143ff3;
    }
    if (fxdSilfVersion == 0x50000) goto LAB_00143ff3;
  }
  fxdSilfVersion = 0xff0000;
LAB_00143ff3:
  this->m_fxdCompilerVersion = fxdSilfVersion;
  return;
}

Assistant:

void SetCompilerVersionFor(int fxdSilfVersion)
	{
		switch (fxdSilfVersion)
		{
		case 0x00010000:	m_fxdCompilerVersion = 0x00010000;		break;
		case 0x00020000:	m_fxdCompilerVersion = 0x00020000;		break;
		case 0x00020001:	m_fxdCompilerVersion = 0x00040001;		break;
		case 0x00030000:	m_fxdCompilerVersion = 0x00030000;		break;
		case 0x00030001:	m_fxdCompilerVersion = 0x00040000;		break;
		case 0x00030002:	m_fxdCompilerVersion = 0x00040001;		break;
		case 0x00040000:	m_fxdCompilerVersion = 0x00040002;		break;
		case 0x00040001:	m_fxdCompilerVersion = 0x00050000;		break;
		case 0x00050000:	m_fxdCompilerVersion = 0x00050000;		break;
		default:			m_fxdCompilerVersion = 0x00FF0000;		break;	// unknown
		}
	}